

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O2

void __thiscall
QStandardItemPrivate::changeFlags(QStandardItemPrivate *this,bool enable,ItemFlags f)

{
  QStandardItem *this_00;
  QFlagsStorage<Qt::ItemFlag> flags;
  ItemFlags IVar1;
  undefined7 in_register_00000031;
  
  this_00 = this->q_ptr;
  IVar1 = QStandardItem::flags(this_00);
  flags.i = ~(uint)f.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i
            & (uint)IVar1.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
                    super_QFlagsStorage<Qt::ItemFlag>.i;
  if ((int)CONCAT71(in_register_00000031,enable) != 0) {
    flags.i = (uint)IVar1.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
                    super_QFlagsStorage<Qt::ItemFlag>.i |
              (uint)f.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i
    ;
  }
  QStandardItem::setFlags(this_00,(ItemFlags)flags.i);
  return;
}

Assistant:

void QStandardItemPrivate::changeFlags(bool enable, Qt::ItemFlags f)
{
    Q_Q(QStandardItem);
    Qt::ItemFlags flags = q->flags();
    if (enable)
        flags |= f;
    else
        flags &= ~f;
    q->setFlags(flags);
}